

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopSnapshot(cmMakefile *this,bool reportError)

{
  Snapshot *this_00;
  bool bVar1;
  allocator local_51;
  string local_50;
  
  this_00 = &this->StateSnapshot;
  while( true ) {
    bVar1 = cmState::Snapshot::CanPopPolicyScope(this_00);
    if (bVar1) break;
    if ((reportError & 1U) != 0) {
      std::__cxx11::string::string
                ((string *)&local_50,"cmake_policy PUSH without matching POP",&local_51);
      IssueMessage(this,FATAL_ERROR,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
    }
    PopPolicy(this);
    reportError = false;
  }
  cmState::Pop((Snapshot *)&local_50,this->GlobalGenerator->CMakeInstance->State,*this_00);
  (this->StateSnapshot).Position.Position = local_50.field_2._M_allocated_capacity;
  this_00->State = (cmState *)local_50._M_dataplus._M_p;
  (this->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmState::SnapshotDataType> *)local_50._M_string_length;
  bVar1 = cmState::Snapshot::IsValid(this_00);
  if (bVar1) {
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                ,0x11f2,"void cmMakefile::PopSnapshot(bool)");
}

Assistant:

void cmMakefile::PopSnapshot(bool reportError)
{
  // cmState::Snapshot manages nested policy scopes within it.
  // Since the scope corresponding to the snapshot is closing,
  // reject any still-open nested policy scopes with an error.
  while (!this->StateSnapshot.CanPopPolicyScope())
    {
    if(reportError)
      {
      this->IssueMessage(cmake::FATAL_ERROR,
                         "cmake_policy PUSH without matching POP");
      reportError = false;
      }
    this->PopPolicy();
    }

  this->StateSnapshot = this->GetState()->Pop(this->StateSnapshot);
  assert(this->StateSnapshot.IsValid());
}